

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  sbyte sVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  Double *pDVar14;
  Double *extraout_RDX;
  byte bVar15;
  Double *this;
  char *pcVar16;
  byte *pbVar17;
  long in_FS_OFFSET;
  double dVar18;
  DiyFp diy_fp;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *result_is_junk = true;
  local_40 = end;
LAB_003eb6dc:
  if (**current == '0') goto code_r0x003eb6e4;
  sVar10 = 0x18;
  if (read_as_double) {
    sVar10 = 0x35;
  }
  bVar4 = false;
  pbVar17 = (byte *)*current;
  bVar15 = *pbVar17;
  iVar6 = (int)(char)bVar15;
  uVar7 = iVar6 - 0x30;
  if (9 < uVar7) {
    if ((byte)(bVar15 + 0x9f) < 6) {
      uVar7 = iVar6 - 0x57;
    }
    else {
      if (5 < (byte)(bVar15 + 0xbf)) {
        if (parse_as_hex_float) {
          if (bVar15 == 0x2e) {
            Advance<char_const*>(current,separator,0x10,&local_40);
            dVar18 = (double)(*(code *)0x3eb775)();
            return dVar18;
          }
          if ((!parse_as_hex_float) || ((bVar15 | 0x20) != 0x70)) goto LAB_003eba45;
        }
        else {
LAB_003eba45:
          if (!allow_trailing_junk) {
            bVar4 = pbVar17 != (byte *)end;
            if ((pbVar17 == (byte *)end) || (bVar5 = isWhitespace((int)(char)*pbVar17), !bVar5))
            goto LAB_003eba9a;
            goto LAB_003eba78;
          }
        }
        uVar8 = 5;
        goto LAB_003eb996;
      }
      uVar7 = iVar6 - 0x37;
    }
  }
  uVar9 = (long)(int)uVar7 >> sVar10;
  if ((int)uVar9 == 0) {
    bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
    uVar8 = (uint)bVar4 + (uint)bVar4 * 4;
    goto LAB_003eb996;
  }
  iVar6 = 1;
  if (1 < (int)uVar9) {
    uVar12 = uVar9 & 0xffffffff;
    do {
      iVar6 = iVar6 + 1;
      uVar12 = uVar12 >> 1;
      uVar8 = (uint)uVar9;
      uVar9 = uVar12;
    } while (3 < uVar8);
  }
  bVar11 = (byte)iVar6;
  uVar9 = (long)(int)uVar7 >> (bVar11 & 0x3f);
  bVar5 = Advance<char_const*>(current,separator,0x10,&local_40);
  bVar15 = 1;
  while (!bVar5) {
    if ((parse_as_hex_float) && (**current == '.')) {
      Advance<char_const*>(current,separator,0x10,&local_40);
      bVar4 = true;
    }
    bVar1 = **current;
    if ((0x3f < (char)bVar1 || 9 < (int)(char)bVar1 - 0x30U) &&
       ((uVar8 = bVar1 - 0x41, 0x25 < uVar8 || ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)))
       ) break;
    bVar15 = bVar15 & bVar1 == 0x30;
    iVar2 = iVar6 + 4;
    if (bVar4) {
      iVar2 = iVar6;
    }
    bVar5 = Advance<char_const*>(current,separator,0x10,&local_40);
    iVar6 = iVar2;
  }
  if (!parse_as_hex_float && !allow_trailing_junk) {
    pcVar16 = *current;
    bVar4 = pcVar16 != end;
    if ((bVar4) && (bVar5 = isWhitespace((int)*pcVar16), bVar5)) {
      do {
        pcVar16 = pcVar16 + 1;
        *current = pcVar16;
        bVar4 = pcVar16 != end;
        if (pcVar16 == end) break;
        bVar5 = isWhitespace((int)*pcVar16);
      } while (bVar5);
    }
    uVar8 = 1;
    if (bVar4) goto LAB_003eb996;
  }
  uVar7 = uVar7 & ~(-1 << (bVar11 & 0x1f));
  pDVar14 = (Double *)(ulong)uVar7;
  uVar8 = 1 << (bVar11 - 1 & 0x1f);
  if ((int)uVar8 < (int)uVar7) {
    bVar4 = (1L << sVar10 & uVar9 + 1) != 0;
    this = (Double *)((long)(uVar9 + 1) >> bVar4);
  }
  else {
    if (uVar7 == uVar8) {
      uVar9 = uVar9 + ((byte)(~bVar15 | (byte)uVar9) & 1);
    }
    bVar4 = (1L << sVar10 & uVar9) != 0;
    pDVar14 = (Double *)((long)uVar9 >> bVar4);
    this = pDVar14;
  }
  uVar7 = iVar6 + (uint)bVar4;
  *result_is_junk = false;
  if (parse_as_hex_float) {
    Advance<char_const*>(current,separator,0x10,&local_40);
    bVar4 = false;
    bVar5 = false;
    if (**current == '+') {
LAB_003ebb10:
      bVar4 = bVar5;
      Advance<char_const*>(current,separator,0x10,&local_40);
    }
    else if (**current == '-') {
      bVar5 = true;
      goto LAB_003ebb10;
    }
    uVar8 = 0;
    do {
      uVar13 = (int)**current - 0x30;
      pDVar14 = (Double *)(ulong)uVar13;
      if (9 < uVar13) break;
      uVar13 = -uVar8;
      if (0 < (int)uVar8) {
        uVar13 = uVar8;
      }
      uVar3 = **current + -0x30 + uVar8 * 10;
      if (0x17bb0 < uVar13) {
        uVar3 = uVar8;
      }
      uVar8 = uVar3;
      bVar5 = Advance<char_const*>(current,separator,0x10,&local_40);
      pDVar14 = extraout_RDX;
    } while (!bVar5);
    uVar13 = -uVar8;
    if (!bVar4) {
      uVar13 = uVar8;
    }
    uVar7 = uVar13 + uVar7;
  }
  if ((uVar7 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar7;
    diy_fp._8_8_ = pDVar14;
    junk_string_value = (double)Double::DiyFpToUint64(this,diy_fp);
    if (sign) {
      junk_string_value = (double)((ulong)junk_string_value ^ (ulong)DAT_004d9200);
    }
    goto LAB_003ebbd3;
  }
  if (!sign) {
LAB_003ebbc1:
    junk_string_value = (double)(long)this;
    goto LAB_003ebbd3;
  }
  if (this != (Double *)0x0) {
    this = (Double *)-(long)this;
    goto LAB_003ebbc1;
  }
  goto LAB_003ebbcb;
code_r0x003eb6e4:
  bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
  if (bVar4) goto code_r0x003eb701;
  goto LAB_003eb6dc;
code_r0x003eb701:
  *result_is_junk = false;
  if (sign) {
LAB_003ebbcb:
    junk_string_value = -0.0;
  }
  else {
    junk_string_value = 0.0;
  }
  goto LAB_003ebbd3;
  while (bVar5 = isWhitespace((int)(char)*pbVar17), bVar5) {
LAB_003eba78:
    pbVar17 = pbVar17 + 1;
    *current = (char *)pbVar17;
    bVar4 = pbVar17 != (byte *)end;
    if (pbVar17 == (byte *)end) break;
  }
LAB_003eba9a:
  if (!bVar4) {
    uVar8 = 5;
LAB_003eb996:
    dVar18 = (double)(*(code *)(&DAT_00594320 + *(int *)(&DAT_00594320 + (ulong)uVar8 * 4)))();
    return dVar18;
  }
LAB_003ebbd3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return junk_string_value;
  }
  __stack_chk_fail();
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}